

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O1

Hashtable * getCurrSymbolsEquiv(void)

{
  UnicodeSetIterator *this;
  ushort uVar1;
  Key key;
  UHashtable *pUVar2;
  uint uVar3;
  UnicodeSetStringSpan *pUVar4;
  UBool UVar5;
  UnicodeSetStringSpan *this_00;
  UVector *pUVar6;
  UnicodeSet *pUVar7;
  UnicodeSet *that;
  UnicodeSet *this_01;
  UnicodeSet *this_02;
  UnicodeString *this_03;
  UnicodeString *this_04;
  UnicodeString *this_05;
  uint uVar8;
  byte bVar9;
  code *uSet;
  bool bVar10;
  UnicodeString exemplar;
  EquivIterator leftIter;
  UnicodeSetIterator it;
  UErrorCode local_134;
  UnicodeSetStringSpan *local_130;
  undefined1 local_128 [64];
  UVector *local_e8;
  EquivIterator local_e0;
  EquivIterator local_c8;
  undefined1 local_b0 [128];
  
  if (gCurrSymbolsEquivInitOnce.fState.super___atomic_base<int>._M_i == 2) {
    return gCurrSymbolsEquiv;
  }
  UVar5 = icu_63::umtx_initImplPreInit(&gCurrSymbolsEquivInitOnce);
  if (UVar5 == '\0') {
    return gCurrSymbolsEquiv;
  }
  local_134 = U_ZERO_ERROR;
  uSet = currency_cleanup;
  ucln_common_registerCleanup_63(UCLN_COMMON_CURRENCY,currency_cleanup);
  this_00 = (UnicodeSetStringSpan *)icu_63::UMemory::operator_new((UMemory *)0x58,(size_t)uSet);
  if (this_00 == (UnicodeSetStringSpan *)0x0) {
    this_00 = (UnicodeSetStringSpan *)0x0;
  }
  else {
    *(undefined8 *)this_00 = 0;
    if (local_134 < U_ILLEGAL_ARGUMENT_ERROR) {
      pUVar7 = &this_00->spanSet;
      uSet = uhash_hashUnicodeString_63;
      uhash_init_63((UHashtable *)pUVar7,uhash_hashUnicodeString_63,uhash_compareUnicodeString_63,
                    (undefined1 *)0x0,&local_134);
      if (local_134 < U_ILLEGAL_ARGUMENT_ERROR) {
        *(UnicodeSet **)this_00 = pUVar7;
        uSet = uprv_deleteUObject_63;
        uhash_setKeyDeleter_63((UHashtable *)pUVar7,uprv_deleteUObject_63);
      }
    }
  }
  pUVar4 = (UnicodeSetStringSpan *)gCurrSymbolsEquiv;
  if (this_00 != (UnicodeSetStringSpan *)0x0) {
    pUVar2 = *(UHashtable **)this_00;
    if (local_134 < U_ILLEGAL_ARGUMENT_ERROR) {
      uSet = deleteUnicode;
      uhash_setValueDeleter_63(pUVar2,deleteUnicode);
      if (local_134 < U_ILLEGAL_ARGUMENT_ERROR) {
        pUVar6 = (UVector *)0x0;
        this = (UnicodeSetIterator *)(local_b0 + 0x40);
        local_130 = this_00;
        while( true ) {
          key = pUVar6[0x159e3].count;
          pUVar7 = (UnicodeSet *)(ulong)(uint)pUVar6[0x159e3].capacity;
          local_e8 = pUVar6;
          icu_63::UnicodeString::UnicodeString((UnicodeString *)local_128,pUVar6[0x159e3].capacity);
          uSet = (code *)icu_63::unisets::get(key);
          if ((UnicodeSet *)uSet == (UnicodeSet *)0x0) break;
          icu_63::UnicodeSetIterator::UnicodeSetIterator(this,(UnicodeSet *)uSet);
          do {
            UVar5 = icu_63::UnicodeSetIterator::next(this);
            if (UVar5 == '\0') {
              bVar9 = 0;
              break;
            }
            uSet = (code *)icu_63::UnicodeSetIterator::getString(this);
            icu_63::UnicodeString::UnicodeString((UnicodeString *)local_b0,(UnicodeString *)uSet);
            if ((local_b0._8_2_ & 1) == 0) {
              uVar8 = local_b0._12_4_;
              if (-1 < (short)local_b0._8_2_) {
                uVar8 = (int)(short)local_b0._8_2_ >> 5;
              }
              uVar3 = local_128._12_4_;
              if (-1 < (short)local_128._8_2_) {
                uVar3 = (int)(short)local_128._8_2_ >> 5;
              }
              uSet = (code *)(ulong)uVar3;
              bVar10 = false;
              if ((((int)(short)local_128._8_2_ & 1U) == 0) && (bVar10 = false, uVar8 == uVar3)) {
                uSet = (code *)local_128;
                UVar5 = icu_63::UnicodeString::doEquals
                                  ((UnicodeString *)local_b0,(UnicodeString *)uSet,uVar8);
                bVar10 = UVar5 != '\0';
                this_00 = local_130;
              }
            }
            else {
              bVar10 = (bool)(local_128[8] & 1);
            }
            bVar9 = 4;
            if (bVar10 == false) {
              if (local_134 < U_ILLEGAL_ARGUMENT_ERROR) {
                if ((local_128._8_2_ & 1) == 0) {
                  uVar8 = local_128._12_4_;
                  if (-1 < (short)local_128._8_2_) {
                    uVar8 = (int)(short)local_128._8_2_ >> 5;
                  }
                  uVar3 = local_b0._12_4_;
                  if (-1 < (short)local_b0._8_2_) {
                    uVar3 = (int)(short)local_b0._8_2_ >> 5;
                  }
                  uSet = (code *)(ulong)uVar3;
                  bVar10 = false;
                  if ((((int)(short)local_b0._8_2_ & 1U) == 0) && (bVar10 = false, uVar8 == uVar3))
                  {
                    uSet = (code *)local_b0;
                    UVar5 = icu_63::UnicodeString::doEquals
                                      ((UnicodeString *)local_128,(UnicodeString *)local_b0,uVar8);
                    bVar10 = UVar5 != '\0';
                    this_00 = local_130;
                  }
                }
                else {
                  bVar10 = (bool)(local_b0[8] & 1);
                }
                if (bVar10 == false) {
                  local_c8._start = (UnicodeString *)local_128;
                  local_e0._hash = (Hashtable *)this_00;
                  local_e0._start = (UnicodeString *)local_b0;
                  local_e0._current = (UnicodeString *)local_b0;
                  local_c8._hash = (Hashtable *)this_00;
                  local_c8._current = local_c8._start;
                  pUVar7 = (UnicodeSet *)icu_63::EquivIterator::next(&local_c8);
                  that = (UnicodeSet *)icu_63::EquivIterator::next(&local_e0);
                  this_01 = pUVar7;
                  this_02 = that;
                  if (that != (UnicodeSet *)0x0 && pUVar7 != (UnicodeSet *)0x0) {
                    do {
                      uVar1 = *(ushort *)
                               &(this_01->super_UnicodeFilter).super_UnicodeMatcher.
                                _vptr_UnicodeMatcher;
                      if ((uVar1 & 1) == 0) {
                        if ((short)uVar1 < 0) {
                          uVar8 = *(uint *)((long)&(this_01->super_UnicodeFilter).
                                                   super_UnicodeMatcher._vptr_UnicodeMatcher + 4);
                        }
                        else {
                          uVar8 = (int)(short)uVar1 >> 5;
                        }
                        uVar3 = local_b0._12_4_;
                        if (-1 < (short)local_b0._8_2_) {
                          uVar3 = (int)(short)local_b0._8_2_ >> 5;
                        }
                        uSet = (code *)(ulong)uVar3;
                        bVar10 = false;
                        if ((((int)(short)local_b0._8_2_ & 1U) == 0) &&
                           (bVar10 = false, uVar8 == uVar3)) {
                          uSet = (code *)local_b0;
                          UVar5 = icu_63::UnicodeString::doEquals
                                            ((UnicodeString *)this_01,(UnicodeString *)local_b0,
                                             uVar8);
                          bVar10 = UVar5 != '\0';
                        }
                      }
                      else {
                        bVar10 = (bool)(local_b0[8] & 1);
                      }
                      this_00 = local_130;
                      if (bVar10 != false) goto LAB_002cb34e;
                      uVar1 = *(ushort *)
                               &(this_02->super_UnicodeFilter).super_UnicodeMatcher.
                                _vptr_UnicodeMatcher;
                      if ((uVar1 & 1) == 0) {
                        if ((short)uVar1 < 0) {
                          uVar8 = *(uint *)((long)&(this_02->super_UnicodeFilter).
                                                   super_UnicodeMatcher._vptr_UnicodeMatcher + 4);
                        }
                        else {
                          uVar8 = (int)(short)uVar1 >> 5;
                        }
                        uVar3 = local_128._12_4_;
                        if (-1 < (short)local_128._8_2_) {
                          uVar3 = (int)(short)local_128._8_2_ >> 5;
                        }
                        uSet = (code *)(ulong)uVar3;
                        bVar10 = false;
                        if ((((int)(short)local_128._8_2_ & 1U) == 0) &&
                           (bVar10 = false, uVar8 == uVar3)) {
                          uSet = (code *)local_128;
                          UVar5 = icu_63::UnicodeString::doEquals
                                            ((UnicodeString *)this_02,(UnicodeString *)uSet,uVar8);
                          bVar10 = UVar5 != '\0';
                        }
                      }
                      else {
                        bVar10 = (bool)(local_128[8] & 1);
                      }
                      this_00 = local_130;
                      if (bVar10 != false) goto LAB_002cb34e;
                      this_01 = (UnicodeSet *)icu_63::EquivIterator::next(&local_c8);
                      this_02 = (UnicodeSet *)icu_63::EquivIterator::next(&local_e0);
                    } while ((this_01 != (UnicodeSet *)0x0) && (this_02 != (UnicodeSet *)0x0));
                  }
                  this_03 = (UnicodeString *)
                            icu_63::UMemory::operator_new((UMemory *)0x40,(size_t)uSet);
                  if (pUVar7 == (UnicodeSet *)0x0 && that == (UnicodeSet *)0x0) {
                    if (this_03 == (UnicodeString *)0x0) {
                      this_03 = (UnicodeString *)0x0;
                    }
                    else {
                      uSet = (code *)local_b0;
                      icu_63::UnicodeString::UnicodeString(this_03,(UnicodeString *)local_b0);
                    }
                    this_04 = (UnicodeString *)
                              icu_63::UMemory::operator_new((UMemory *)0x40,(size_t)uSet);
                    if (this_04 == (UnicodeString *)0x0) goto LAB_002cb294;
                    pUVar7 = (UnicodeSet *)local_128;
                    icu_63::UnicodeString::UnicodeString(this_04,(UnicodeString *)pUVar7);
                  }
                  else if (that == (UnicodeSet *)0x0) {
                    if (this_03 == (UnicodeString *)0x0) {
                      this_03 = (UnicodeString *)0x0;
                    }
                    else {
                      uSet = (code *)local_b0;
                      icu_63::UnicodeString::UnicodeString(this_03,(UnicodeString *)local_b0);
                    }
                    this_04 = (UnicodeString *)
                              icu_63::UMemory::operator_new((UMemory *)0x40,(size_t)uSet);
                    if (this_04 == (UnicodeString *)0x0) goto LAB_002cb294;
                    icu_63::UnicodeString::UnicodeString(this_04,(UnicodeString *)pUVar7);
                  }
                  else if (pUVar7 == (UnicodeSet *)0x0) {
                    if (this_03 == (UnicodeString *)0x0) {
                      this_03 = (UnicodeString *)0x0;
                    }
                    else {
                      icu_63::UnicodeString::UnicodeString(this_03,(UnicodeString *)that);
                      uSet = (code *)that;
                    }
                    this_04 = (UnicodeString *)
                              icu_63::UMemory::operator_new((UMemory *)0x40,(size_t)uSet);
                    if (this_04 == (UnicodeString *)0x0) goto LAB_002cb294;
                    pUVar7 = (UnicodeSet *)local_128;
                    icu_63::UnicodeString::UnicodeString(this_04,(UnicodeString *)pUVar7);
                  }
                  else {
                    if (this_03 == (UnicodeString *)0x0) {
                      this_03 = (UnicodeString *)0x0;
                    }
                    else {
                      icu_63::UnicodeString::UnicodeString(this_03,(UnicodeString *)that);
                      uSet = (code *)that;
                    }
                    this_04 = (UnicodeString *)
                              icu_63::UMemory::operator_new((UMemory *)0x40,(size_t)uSet);
                    if (this_04 == (UnicodeString *)0x0) {
LAB_002cb294:
                      pUVar7 = (UnicodeSet *)uSet;
                      this_04 = (UnicodeString *)0x0;
                    }
                    else {
                      icu_63::UnicodeString::UnicodeString(this_04,(UnicodeString *)pUVar7);
                    }
                  }
                  if (this_04 == (UnicodeString *)0x0 || this_03 == (UnicodeString *)0x0) {
                    if (this_03 != (UnicodeString *)0x0) {
                      (*(this_03->super_Replaceable).super_UObject._vptr_UObject[1])(this_03);
                    }
                    if (this_04 != (UnicodeString *)0x0) {
                      (*(this_04->super_Replaceable).super_UObject._vptr_UObject[1])(this_04);
                    }
                    local_134 = U_MEMORY_ALLOCATION_ERROR;
                    uSet = (code *)pUVar7;
                    this_00 = local_130;
                  }
                  else {
                    pUVar2 = *(UHashtable **)local_130;
                    this_05 = (UnicodeString *)
                              icu_63::UMemory::operator_new((UMemory *)0x40,(size_t)pUVar7);
                    if (this_05 == (UnicodeString *)0x0) {
                      this_05 = (UnicodeString *)0x0;
                    }
                    else {
                      icu_63::UnicodeString::UnicodeString(this_05,(UnicodeString *)local_128);
                    }
                    uhash_put_63(pUVar2,this_05,this_03,&local_134);
                    pUVar2 = *(UHashtable **)local_130;
                    uSet = (code *)icu_63::UMemory::operator_new((UMemory *)0x40,(size_t)this_05);
                    if ((UnicodeSet *)uSet == (UnicodeSet *)0x0) {
                      uSet = (code *)0x0;
                    }
                    else {
                      icu_63::UnicodeString::UnicodeString
                                ((UnicodeString *)uSet,(UnicodeString *)local_b0);
                    }
                    uhash_put_63(pUVar2,uSet,this_04,&local_134);
                    this_00 = local_130;
                  }
                }
              }
LAB_002cb34e:
              bVar9 = U_ZERO_ERROR < local_134;
            }
            icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_b0);
          } while ((bVar9 & 3) == 0);
          icu_63::UnicodeSetIterator::~UnicodeSetIterator(this);
          icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_128);
          if ((bVar9 != 0) || (pUVar6 = (UVector *)&local_e8->count, pUVar6 == (UVector *)0x20))
          goto LAB_002cb3a2;
        }
        icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_128);
        uSet = (code *)pUVar7;
      }
LAB_002cb3a2:
      pUVar4 = this_00;
      if (local_134 < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_002cb3be;
      if (*(UHashtable **)this_00 != (UHashtable *)0x0) {
        uhash_close_63(*(UHashtable **)this_00);
      }
    }
    else if (pUVar2 != (UHashtable *)0x0) {
      uhash_close_63(pUVar2);
    }
    icu_63::UMemory::operator_delete((UMemory *)this_00,uSet);
    pUVar4 = (UnicodeSetStringSpan *)gCurrSymbolsEquiv;
  }
LAB_002cb3be:
  gCurrSymbolsEquiv = (Hashtable *)pUVar4;
  icu_63::umtx_initImplPostInit(&gCurrSymbolsEquivInitOnce);
  return gCurrSymbolsEquiv;
}

Assistant:

static void cleanup(void) {
        while (gCRegHead) {
            CReg* n = gCRegHead;
            gCRegHead = gCRegHead->next;
            delete n;
        }
    }